

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  uint64_t *puVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe i;
  secp256k1_fe i2;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe h2;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe t;
  secp256k1_fe local_228;
  secp256k1_fe local_1f8;
  secp256k1_fe local_1d0;
  secp256k1_gej *local_1a8;
  uint64_t local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  uint64_t local_178;
  secp256k1_fe local_170;
  secp256k1_fe local_148;
  secp256k1_fe local_120;
  secp256k1_fe local_f8;
  secp256k1_fe local_d0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      a_00 = &a->z;
      secp256k1_fe_sqr(&local_80,a_00);
      uVar2 = (a->x).n[4];
      local_1f8.n[0] = (uVar2 >> 0x30) * 0x1000003d1 + (a->x).n[0];
      local_1f8.n[1] = (local_1f8.n[0] >> 0x34) + (a->x).n[1];
      local_1f8.n[2] = (local_1f8.n[1] >> 0x34) + (a->x).n[2];
      local_1f8.n[0] = local_1f8.n[0] & 0xfffffffffffff;
      local_1f8.n[1] = local_1f8.n[1] & 0xfffffffffffff;
      local_1f8.n[3] = (local_1f8.n[2] >> 0x34) + (a->x).n[3];
      local_1f8.n[2] = local_1f8.n[2] & 0xfffffffffffff;
      local_1f8.n[4] = (local_1f8.n[3] >> 0x34) + (uVar2 & 0xffffffffffff);
      local_1f8.n[3] = local_1f8.n[3] & 0xfffffffffffff;
      local_198 = local_1f8.n[0];
      local_190 = local_1f8.n[1];
      local_188 = local_1f8.n[2];
      local_180 = local_1f8.n[3];
      local_178 = local_1f8.n[4];
      secp256k1_fe_mul(&local_a8,&b->x,&local_80);
      uVar2 = (a->y).n[4];
      uVar12 = (uVar2 >> 0x30) * 0x1000003d1 + (a->y).n[0];
      uVar13 = (uVar12 >> 0x34) + (a->y).n[1];
      uVar12 = uVar12 & 0xfffffffffffff;
      uVar11 = (uVar13 >> 0x34) + (a->y).n[2];
      uVar8 = (uVar11 >> 0x34) + (a->y).n[3];
      uVar13 = uVar13 & 0xfffffffffffff;
      uVar11 = uVar11 & 0xfffffffffffff;
      local_228.n[4] = (uVar8 >> 0x34) + (uVar2 & 0xffffffffffff);
      uVar8 = uVar8 & 0xfffffffffffff;
      local_228.n[0] = uVar12;
      local_228.n[1] = uVar13;
      local_228.n[2] = uVar11;
      local_228.n[3] = uVar8;
      local_1a8 = a;
      local_1a0 = local_228.n[4];
      secp256k1_fe_mul(&local_120,&b->y,&local_80);
      secp256k1_fe_mul(&local_120,&local_120,a_00);
      local_148.n[0] = (0x3ffffbfffff0bc - local_198) + local_a8.n[0];
      local_148.n[1] = (0x3ffffffffffffc - local_190) + local_a8.n[1];
      local_148.n[2] = (0x3ffffffffffffc - local_188) + local_a8.n[2];
      local_148.n[3] = (0x3ffffffffffffc - local_180) + local_a8.n[3];
      local_148.n[4] = (0x3fffffffffffc - local_178) + local_a8.n[4];
      local_1d0.n[0] = (0x3ffffbfffff0bc - uVar12) + local_120.n[0];
      local_1d0.n[1] = (0x3ffffffffffffc - uVar13) + local_120.n[1];
      local_1d0.n[2] = (0x3ffffffffffffc - uVar11) + local_120.n[2];
      local_1d0.n[3] = (0x3ffffffffffffc - uVar8) + local_120.n[3];
      local_1d0.n[4] = (0x3fffffffffffc - local_1a0) + local_120.n[4];
      iVar3 = secp256k1_fe_normalizes_to_zero_var(&local_148);
      if (iVar3 == 0) {
        secp256k1_fe_sqr(&local_170,&local_1d0);
        secp256k1_fe_sqr(&local_d0,&local_148);
        secp256k1_fe_mul(&local_f8,&local_148,&local_d0);
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = local_148.n[4];
          rzr->n[2] = local_148.n[2];
          rzr->n[3] = local_148.n[3];
          rzr->n[0] = local_148.n[0];
          rzr->n[1] = local_148.n[1];
        }
        secp256k1_fe_mul(&r->z,a_00,&local_148);
        secp256k1_fe_mul(&local_58,&local_1f8,&local_d0);
        (r->x).n[0] = local_58.n[0];
        (r->x).n[1] = local_58.n[1];
        (r->x).n[2] = local_58.n[2];
        (r->x).n[3] = local_58.n[3];
        (r->x).n[4] = local_58.n[4];
        uVar6 = (r->x).n[1];
        uVar5 = (r->x).n[0] * 2;
        (r->x).n[0] = uVar5;
        uVar6 = uVar6 * 2;
        (r->x).n[1] = uVar6;
        uVar9 = (r->x).n[3];
        uVar10 = (r->x).n[2] * 2;
        (r->x).n[2] = uVar10;
        uVar9 = uVar9 * 2;
        (r->x).n[3] = uVar9;
        (r->x).n[4] = local_58.n[4] * 2;
        uVar5 = uVar5 + local_f8.n[0];
        (r->x).n[0] = uVar5;
        uVar6 = uVar6 + local_f8.n[1];
        (r->x).n[1] = uVar6;
        uVar10 = uVar10 + local_f8.n[2];
        (r->x).n[2] = uVar10;
        uVar9 = uVar9 + local_f8.n[3];
        (r->x).n[3] = uVar9;
        uVar5 = 0x7ffff7ffffe178 - uVar5;
        (r->x).n[0] = uVar5;
        uVar6 = 0x7ffffffffffff8 - uVar6;
        (r->x).n[1] = uVar6;
        uVar10 = 0x7ffffffffffff8 - uVar10;
        (r->x).n[2] = uVar10;
        uVar9 = 0x7ffffffffffff8 - uVar9;
        (r->x).n[3] = uVar9;
        uVar7 = 0x7fffffffffff8 - (local_58.n[4] * 2 + local_f8.n[4]);
        (r->x).n[4] = uVar7;
        uVar5 = uVar5 + local_170.n[0];
        (r->x).n[0] = uVar5;
        uVar6 = uVar6 + local_170.n[1];
        (r->x).n[1] = uVar6;
        uVar10 = uVar10 + local_170.n[2];
        (r->x).n[2] = uVar10;
        uVar9 = uVar9 + local_170.n[3];
        (r->x).n[3] = uVar9;
        uVar7 = uVar7 + local_170.n[4];
        (r->x).n[4] = uVar7;
        uVar5 = 0xbffff3ffffd234 - uVar5;
        (r->y).n[0] = uVar5;
        uVar6 = 0xbffffffffffff4 - uVar6;
        (r->y).n[1] = uVar6;
        uVar10 = 0xbffffffffffff4 - uVar10;
        (r->y).n[2] = uVar10;
        uVar9 = 0xbffffffffffff4 - uVar9;
        (r->y).n[3] = uVar9;
        uVar7 = 0xbfffffffffff4 - uVar7;
        (r->y).n[4] = uVar7;
        (r->y).n[0] = uVar5 + local_58.n[0];
        (r->y).n[1] = uVar6 + local_58.n[1];
        (r->y).n[2] = uVar10 + local_58.n[2];
        (r->y).n[3] = uVar9 + local_58.n[3];
        (r->y).n[4] = uVar7 + local_58.n[4];
        secp256k1_fe_mul(&r->y,&r->y,&local_1d0);
        secp256k1_fe_mul(&local_f8,&local_f8,&local_228);
        uVar6 = (r->y).n[1];
        (r->y).n[0] = (r->y).n[0] + (0x3ffffbfffff0bc - local_f8.n[0]);
        (r->y).n[1] = uVar6 + (0x3ffffffffffffc - local_f8.n[1]);
        uVar6 = (r->y).n[3];
        (r->y).n[2] = (r->y).n[2] + (0x3ffffffffffffc - local_f8.n[2]);
        (r->y).n[3] = uVar6 + (0x3ffffffffffffc - local_f8.n[3]);
        puVar1 = (r->y).n + 4;
        *puVar1 = *puVar1 + (0x3fffffffffffc - local_f8.n[4]);
      }
      else {
        iVar3 = secp256k1_fe_normalizes_to_zero_var(&local_1d0);
        if (iVar3 != 0) {
          secp256k1_gej_double_var(r,local_1a8,rzr);
          return;
        }
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[2] = 0;
          rzr->n[3] = 0;
          rzr->n[0] = 0;
          rzr->n[1] = 0;
          rzr->n[4] = 0;
        }
        r->infinity = 1;
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
      }
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar6 = (b->x).n[1];
    uVar9 = (b->x).n[2];
    uVar5 = (b->x).n[3];
    (r->x).n[0] = (b->x).n[0];
    (r->x).n[1] = uVar6;
    (r->x).n[2] = uVar9;
    (r->x).n[3] = uVar5;
    (r->x).n[4] = (b->x).n[4];
    uVar6 = (b->y).n[1];
    uVar9 = (b->y).n[2];
    uVar5 = (b->y).n[3];
    (r->y).n[0] = (b->y).n[0];
    (r->y).n[1] = uVar6;
    (r->y).n[2] = uVar9;
    (r->y).n[3] = uVar5;
    (r->y).n[4] = (b->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* 8 mul, 3 sqr, 4 normalize, 12 mul_int/add/negate */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }
    r->infinity = 0;

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            r->infinity = 1;
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}